

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_plane_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_fc;
  pel local_f8;
  int local_f4;
  int local_f0;
  pel local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int temp2_v;
  int temp2_u;
  int y2;
  int x2;
  int val_v;
  int val_u;
  int max_pel;
  int temp_v;
  int temp_u;
  int is_v;
  int im_v;
  int is_h;
  int im_h;
  int idx_h;
  int idx_w;
  int ib_shift [5];
  int ib_mult [5];
  int height2;
  int width2;
  int h2;
  int w2;
  int y;
  int x;
  int c_v;
  int b_v;
  int a_v;
  int c_u;
  int b_u;
  int a_u;
  int coef_ver_v;
  int coef_hor_v;
  int coef_ver_u;
  int coef_hor_u;
  pel *rsrc;
  int bit_depth_local;
  int h_local;
  int w_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  
  coef_hor_v = 0;
  coef_ver_v = 0;
  a_u = 0;
  b_u = 0;
  iVar3 = w >> 1;
  iVar4 = h >> 1;
  iVar5 = w * 2;
  ib_mult[4] = h * 2;
  ib_mult[0] = 5;
  ib_mult[1] = 0xb;
  ib_mult[2] = 0x17;
  _idx_h = 0xa00000007;
  ib_shift[0] = 0xb;
  ib_shift[1] = 0xf;
  ib_shift[2] = 0x13;
  iVar6 = (1 << ((byte)bit_depth & 0x1f)) + -1;
  for (w2 = 1; w2 < iVar3 + 1; w2 = w2 + 1) {
    coef_hor_v = w2 * ((uint)src[(long)(w2 * 2) + (long)w] - (uint)src[(long)(w2 * -2) + (long)w]) +
                 coef_hor_v;
    a_u = w2 * ((uint)src[(long)(w2 * 2 + 1) + (long)w] - (uint)src[(long)(w2 * -2 + 1) + (long)w])
          + a_u;
  }
  for (h2 = 1; h2 < iVar4 + 1; h2 = h2 + 1) {
    coef_ver_v = h2 * ((uint)src[(long)(h2 * -2) - (long)h] - (uint)src[(long)(h2 * 2) - (long)h]) +
                 coef_ver_v;
    b_u = h2 * ((uint)src[(long)(h2 * -2 + 1) - (long)h] - (uint)src[(long)(h2 * 2 + 1) - (long)h])
          + b_u;
  }
  bVar1 = (byte)(&idx_h)[g_tbl_log2[w] + -2];
  iVar7 = coef_hor_v * 0x20 * ib_mult[(long)(g_tbl_log2[w] + -2) + -2] + (1 << (bVar1 - 1 & 0x1f))
          >> (bVar1 & 0x1f);
  bVar2 = (byte)(&idx_h)[g_tbl_log2[h] + -2];
  iVar8 = coef_ver_v * 0x20 * ib_mult[(long)(g_tbl_log2[h] + -2) + -2] + (1 << (bVar2 - 1 & 0x1f))
          >> (bVar2 & 0x1f);
  iVar9 = a_u * 0x20 * ib_mult[(long)(g_tbl_log2[w] + -2) + -2] + (1 << (bVar1 - 1 & 0x1f)) >>
          (bVar1 & 0x1f);
  iVar10 = b_u * 0x20 * ib_mult[(long)(g_tbl_log2[h] + -2) + -2] + (1 << (bVar2 - 1 & 0x1f)) >>
           (bVar2 & 0x1f);
  max_pel = ((((uint)src[h * -2] + (uint)src[iVar5]) * 0x10 - (iVar4 + -1) * iVar8) -
            (iVar3 + -1) * iVar7) + 0x10;
  val_u = ((((uint)src[h * -2 + 1] + (uint)src[iVar5 + 1]) * 0x10 - (iVar4 + -1) * iVar10) -
          (iVar3 + -1) * iVar9) + 0x10;
  _w_local = dst;
  for (h2 = 0; h2 < h; h2 = h2 + 1) {
    local_e0 = max_pel;
    local_e4 = val_u;
    for (w2 = 0; w2 < iVar5; w2 = w2 + 2) {
      local_f0 = local_e0 >> 5;
      local_fc = local_e4 >> 5;
      local_e0 = iVar7 + local_e0;
      local_e4 = iVar9 + local_e4;
      local_e8 = local_f0;
      if (iVar6 < local_f0) {
        local_e8 = iVar6;
      }
      if (local_e8 < 0) {
        local_ec = '\0';
      }
      else {
        if (iVar6 < local_f0) {
          local_f0 = iVar6;
        }
        local_ec = (pel)local_f0;
      }
      _w_local[w2] = local_ec;
      local_f4 = local_fc;
      if (iVar6 < local_fc) {
        local_f4 = iVar6;
      }
      if (local_f4 < 0) {
        local_f8 = '\0';
      }
      else {
        if (iVar6 < local_fc) {
          local_fc = iVar6;
        }
        local_f8 = (pel)local_fc;
      }
      _w_local[w2 + 1] = local_f8;
    }
    max_pel = iVar8 + max_pel;
    val_u = iVar10 + val_u;
    _w_local = _w_local + i_dst;
  }
  return;
}

Assistant:

void ipred_plane_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    pel *rsrc;
    int  coef_hor_u = 0, coef_ver_u = 0;
    int  coef_hor_v = 0, coef_ver_v = 0;
    int  a_u, b_u, c_u, a_v, b_v, c_v, x, y;
    int  w2 = w >> 1;
    int  h2 = h >> 1;
    int  width2  = w << 1;
    int  height2 = h << 1;
    int  ib_mult[5] = { 13, 17, 5, 11, 23 };
    int  ib_shift[5] = { 7, 10, 11, 15, 19 };
    int  idx_w = g_tbl_log2[w] - 2;
    int  idx_h = g_tbl_log2[h] - 2;
    int  im_h, is_h, im_v, is_v;
    int  temp_u, temp_v;
    int  max_pel = (1 << bit_depth) - 1;
    int  val_u, val_v;

    im_h = ib_mult[idx_w];
    is_h = ib_shift[idx_w];
    im_v = ib_mult[idx_h];
    is_v = ib_shift[idx_h];
    rsrc = src + w;
    for (x = 1; x < w2 + 1; x++)
    {
        int x2 = x << 1;
        coef_hor_u += x * (rsrc[x2] - rsrc[-x2]);
        coef_hor_v += x * (rsrc[x2 + 1] - rsrc[-x2 + 1]);
    }
    rsrc = src - h;
    for (y = 1; y < h2 + 1; y++)
    {
        int y2 = y << 1;
        coef_ver_u += y * (rsrc[-y2] - rsrc[y2]);
        coef_ver_v += y * (rsrc[-y2 + 1] - rsrc[y2 + 1]);
    }
    a_u = (src[-height2] + src[width2]) << 4;
    b_u = ((coef_hor_u << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_u = ((coef_ver_u << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    a_v = (src[-height2 + 1] + src[width2 + 1]) << 4;
    b_v = ((coef_hor_v << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_v = ((coef_ver_v << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    temp_u = a_u - (h2 - 1) * c_u - (w2 - 1) * b_u + 16;
    temp_v = a_v - (h2 - 1) * c_v - (w2 - 1) * b_v + 16;

    for (y = 0; y < h; y++) {
        int temp2_u = temp_u;
        int temp2_v = temp_v;
        for (x = 0; x < width2; x += 2) {
            val_u = temp2_u >> 5;
            val_v = temp2_v >> 5;
            temp2_u += b_u;
            temp2_v += b_v;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
        }
        temp_u += c_u;
        temp_v += c_v;
        dst += i_dst;
    }
}